

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::LowerSlotArrayCheck(Lowerer *this,Instr *instr)

{
  Instr *insertBeforeInstr;
  Instr *pIVar1;
  Opnd *this_00;
  code *pcVar2;
  uint uVar3;
  OpndKind OVar4;
  bool bVar5;
  undefined4 *puVar6;
  Lowerer *this_01;
  RegOpnd *pRVar7;
  IndirOpnd *pIVar8;
  LabelInstr *instr_00;
  LabelInstr *target;
  Instr *instr_01;
  Func *func;
  Lowerer *this_02;
  StackSym *sym;
  
  insertBeforeInstr = instr->m_next;
  pIVar1 = instr->m_prev;
  this_00 = instr->m_dst;
  OVar4 = IR::Opnd::GetKind(this_00);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) goto LAB_005c061e;
    *puVar6 = 0;
  }
  sym = (StackSym *)this_00[1]._vptr_Opnd;
  this_01 = (Lowerer *)IR::Instr::UnlinkSrc2(instr);
  OVar4 = IR::Opnd::GetKind((Opnd *)this_01);
  if (OVar4 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar5) goto LAB_005c061e;
    *puVar6 = 0;
  }
  uVar3 = (uint)(this_01->m_lowererMD).m_func;
  if (0xfffffffc < uVar3 - 2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6fcc,"(slotId != (uint32)-1 && slotId >= Js::ScopeSlots::FirstSlotIndex)",
                       "slotId != (uint32)-1 && slotId >= Js::ScopeSlots::FirstSlotIndex");
    if (!bVar5) {
LAB_005c061e:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if (2 < uVar3) {
    func = this->m_func;
    if ((func->stackClosure == true) &&
       ((sym->super_Sym).m_id == (func->m_localClosureSym->super_Sym).m_id)) {
      pRVar7 = IR::RegOpnd::New(sym,TyVar,func);
      pIVar8 = IR::IndirOpnd::New(pRVar7,0,TyVar,this->m_func,false);
      pRVar7 = IR::RegOpnd::New(TyVar,this->m_func);
      InsertMove(&pRVar7->super_Opnd,&pIVar8->super_Opnd,insertBeforeInstr,true);
      sym = pRVar7->m_sym;
      func = this->m_func;
    }
    instr_00 = IR::LabelInstr::New(Label,func,true);
    target = IR::LabelInstr::New(Label,this->m_func,false);
    pRVar7 = IR::RegOpnd::New(sym,TyVar,this->m_func);
    pIVar8 = IR::IndirOpnd::New(pRVar7,0,TyVar,this->m_func,true);
    this_02 = this_01;
    IR::IntConstOpnd::SetValue((IntConstOpnd *)this_01,(ulong)(uVar3 - 2));
    InsertCompareBranch(this_02,&pIVar8->super_Opnd,(Opnd *)this_01,BrGt_A,true,target,
                        insertBeforeInstr,false);
    IR::Instr::InsertBefore(insertBeforeInstr,&instr_00->super_Instr);
    instr_01 = IR::Instr::New(Call,this->m_func);
    IR::Instr::InsertBefore(insertBeforeInstr,instr_01);
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,instr_01,HelperOp_FatalInternalError,(LabelInstr *)0x0,(Opnd *)0x0
               ,(PropertySymOpnd *)0x0,false);
    IR::Instr::InsertBefore(insertBeforeInstr,&target->super_Instr);
  }
  LowererMD::ChangeToAssign(instr);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerSlotArrayCheck(IR::Instr * instr)
{
    IR::Instr *instrPrev = instr->m_prev;
    IR::Instr *insertInstr = instr->m_next;

    IR::RegOpnd *slotArrayOpnd = instr->GetDst()->AsRegOpnd();
    StackSym *stackSym = slotArrayOpnd->m_sym;

    IR::IntConstOpnd *slotIdOpnd = instr->UnlinkSrc2()->AsIntConstOpnd();
    uint32 slotId = (uint32)slotIdOpnd->GetValue();
    Assert(slotId != (uint32)-1 && slotId >= Js::ScopeSlots::FirstSlotIndex);

    if (slotId > Js::ScopeSlots::FirstSlotIndex)
    {
        if (m_func->DoStackFrameDisplay() && stackSym->m_id == m_func->GetLocalClosureSym()->m_id)
        {
            // The pointer we loaded points to the reserved/known address where the slot array can be boxed.
            // Deref to get the real value.
            IR::IndirOpnd * srcOpnd = IR::IndirOpnd::New(IR::RegOpnd::New(stackSym, TyVar, m_func), 0, TyVar, m_func);
            IR::RegOpnd * dstOpnd = IR::RegOpnd::New(TyVar, m_func);
            InsertMove(dstOpnd, srcOpnd, insertInstr);
            stackSym = dstOpnd->m_sym;
        }

        IR::LabelInstr *errorLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
        IR::LabelInstr *continueLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);

        IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(IR::RegOpnd::New(stackSym, TyVar, m_func),
                                                       Js::ScopeSlots::EncodedSlotCountSlotIndex * sizeof(Js::Var),
                                                       TyVar, m_func, true);

        slotIdOpnd->SetValue(slotId - Js::ScopeSlots::FirstSlotIndex);
        InsertCompareBranch(indirOpnd, slotIdOpnd, Js::OpCode::BrGt_A, true, continueLabel, insertInstr);

        insertInstr->InsertBefore(errorLabel);
        IR::Instr * instrHelper = IR::Instr::New(Js::OpCode::Call, m_func);
        insertInstr->InsertBefore(instrHelper);
        m_lowererMD.ChangeToHelperCall(instrHelper, IR::HelperOp_FatalInternalError);
        insertInstr->InsertBefore(continueLabel);
    }

    m_lowererMD.ChangeToAssign(instr);

    return instrPrev;
}